

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O0

int rd_pick_intra_angle_sbuv
              (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,int rate_overhead,int64_t best_rd,
              int *rate,RD_STATS *rd_stats)

{
  long lVar1;
  bool bVar2;
  int64_t iVar3;
  long lVar4;
  sbyte sVar5;
  long in_RSI;
  long in_R8;
  int *in_stack_00000008;
  int skip_search;
  int64_t rd_thresh;
  int64_t rd_cost [10];
  int64_t best_rd_in;
  int64_t this_rd;
  int best_angle_delta;
  int angle_delta;
  int i;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  int64_t *local_d0;
  int64_t aiStackY_b8 [2];
  int *in_stack_ffffffffffffff58;
  int64_t in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff68;
  BLOCK_SIZE in_stack_ffffffffffffff6f;
  MACROBLOCK *in_stack_ffffffffffffff70;
  AV1_COMP *in_stack_ffffffffffffff78;
  RD_STATS *in_stack_ffffffffffffff90;
  int *in_stack_ffffffffffffff98;
  int64_t *in_stack_ffffffffffffffa0;
  int local_48;
  int local_44;
  
  lVar1 = **(long **)(in_RSI + 0x2058);
  *in_stack_00000008 = 0x7fffffff;
  *(undefined1 *)(in_stack_00000008 + 8) = 0;
  in_stack_00000008[2] = -1;
  in_stack_00000008[3] = 0x7fffffff;
  for (local_44 = 0; local_44 < 10; local_44 = local_44 + 1) {
    aiStackY_b8[local_44] = 0x7fffffffffffffff;
  }
  local_48 = 0;
  local_d0 = in_stack_ffffffffffffffa0;
  do {
    if (3 < local_48) {
      for (local_48 = 1; local_48 < 4; local_48 = local_48 + 2) {
        for (local_44 = 0; local_44 < 2; local_44 = local_44 + 1) {
          bVar2 = false;
          lVar4 = in_R8 + (in_R8 >> 5);
          if ((lVar4 < aiStackY_b8[(local_48 + 1) * 2 + local_44]) &&
             (lVar4 < aiStackY_b8[(local_48 + -1) * 2 + local_44])) {
            bVar2 = true;
          }
          if (!bVar2) {
            *(char *)(lVar1 + 0x59) = ((char)local_44 * -2 + '\x01') * (char)local_48;
            pick_intra_angle_routine_sbuv
                      (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6f
                       ,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                       in_stack_ffffffffffffff58,in_stack_ffffffffffffff90,in_stack_ffffffffffffff98
                       ,local_d0);
          }
        }
      }
      *(undefined1 *)(lVar1 + 0x59) = 0;
      return (uint)(*in_stack_00000008 != 0x7fffffff);
    }
    for (local_44 = 0; local_44 < 2; local_44 = local_44 + 1) {
      if (in_R8 == 0x7fffffffffffffff) {
        local_d0 = (int64_t *)0x7fffffffffffffff;
      }
      else {
        sVar5 = 5;
        if (local_48 == 0) {
          sVar5 = 3;
        }
        local_d0 = (int64_t *)(in_R8 + (in_R8 >> sVar5));
      }
      *(char *)(lVar1 + 0x59) = ((char)local_44 * -2 + '\x01') * (char)local_48;
      iVar3 = pick_intra_angle_routine_sbuv
                        (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                         in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68,
                         in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                         in_stack_ffffffffffffff90,in_stack_ffffffffffffff98,local_d0);
      aiStackY_b8[local_48 * 2 + local_44] = iVar3;
      if (local_48 == 0) {
        if (iVar3 == 0x7fffffffffffffff) {
          return 0;
        }
        aiStackY_b8[1] = iVar3;
        break;
      }
    }
    local_48 = local_48 + 2;
  } while( true );
}

Assistant:

static int rd_pick_intra_angle_sbuv(const AV1_COMP *const cpi, MACROBLOCK *x,
                                    BLOCK_SIZE bsize, int rate_overhead,
                                    int64_t best_rd, int *rate,
                                    RD_STATS *rd_stats) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *mbmi = xd->mi[0];
  assert(!is_inter_block(mbmi));
  int i, angle_delta, best_angle_delta = 0;
  int64_t this_rd, best_rd_in, rd_cost[2 * (MAX_ANGLE_DELTA + 2)];

  rd_stats->rate = INT_MAX;
  rd_stats->skip_txfm = 0;
  rd_stats->dist = INT64_MAX;
  for (i = 0; i < 2 * (MAX_ANGLE_DELTA + 2); ++i) rd_cost[i] = INT64_MAX;

  for (angle_delta = 0; angle_delta <= MAX_ANGLE_DELTA; angle_delta += 2) {
    for (i = 0; i < 2; ++i) {
      best_rd_in = (best_rd == INT64_MAX)
                       ? INT64_MAX
                       : (best_rd + (best_rd >> ((angle_delta == 0) ? 3 : 5)));
      mbmi->angle_delta[PLANE_TYPE_UV] = (1 - 2 * i) * angle_delta;
      this_rd = pick_intra_angle_routine_sbuv(cpi, x, bsize, rate_overhead,
                                              best_rd_in, rate, rd_stats,
                                              &best_angle_delta, &best_rd);
      rd_cost[2 * angle_delta + i] = this_rd;
      if (angle_delta == 0) {
        if (this_rd == INT64_MAX) return 0;
        rd_cost[1] = this_rd;
        break;
      }
    }
  }

  assert(best_rd != INT64_MAX);
  for (angle_delta = 1; angle_delta <= MAX_ANGLE_DELTA; angle_delta += 2) {
    int64_t rd_thresh;
    for (i = 0; i < 2; ++i) {
      int skip_search = 0;
      rd_thresh = best_rd + (best_rd >> 5);
      if (rd_cost[2 * (angle_delta + 1) + i] > rd_thresh &&
          rd_cost[2 * (angle_delta - 1) + i] > rd_thresh)
        skip_search = 1;
      if (!skip_search) {
        mbmi->angle_delta[PLANE_TYPE_UV] = (1 - 2 * i) * angle_delta;
        pick_intra_angle_routine_sbuv(cpi, x, bsize, rate_overhead, best_rd,
                                      rate, rd_stats, &best_angle_delta,
                                      &best_rd);
      }
    }
  }

  mbmi->angle_delta[PLANE_TYPE_UV] = best_angle_delta;
  return rd_stats->rate != INT_MAX;
}